

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_encoder.c
# Opt level: O2

lzma_ret lzma_stream_footer_encode(lzma_stream_flags *options,uint8_t *out)

{
  ulong uVar1;
  uint32_t uVar2;
  lzma_ret lVar3;
  
  if (options->version == 0) {
    uVar1 = options->backward_size;
    lVar3 = LZMA_PROG_ERROR;
    if (((uVar1 & 3) == 0 && uVar1 - 4 < 0x3fffffffd) &&
       (*(int *)(out + 4) = (int)(uVar1 >> 2) + -1, options->check < 0x10)) {
      out[8] = '\0';
      out[9] = (char)options->check;
      lVar3 = LZMA_OK;
      uVar2 = lzma_crc32(out + 4,6,0);
      *(uint32_t *)out = uVar2;
      *(uint8_t (*) [2])(out + 10) = (uint8_t  [2])0x5a59;
    }
  }
  else {
    lVar3 = LZMA_OPTIONS_ERROR;
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_footer_encode(const lzma_stream_flags *options, uint8_t *out)
{
	uint32_t crc;

	assert(2 * 4 + LZMA_STREAM_FLAGS_SIZE + sizeof(lzma_footer_magic)
			== LZMA_STREAM_HEADER_SIZE);

	if (options->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Backward Size
	if (!is_backward_size_valid(options))
		return LZMA_PROG_ERROR;

	unaligned_write32le(out + 4, options->backward_size / 4 - 1);

	// Stream Flags
	if (stream_flags_encode(options, out + 2 * 4))
		return LZMA_PROG_ERROR;

	// CRC32
	crc = lzma_crc32(
			out + 4, 4 + LZMA_STREAM_FLAGS_SIZE, 0);

	unaligned_write32le(out, crc);

	// Magic
	memcpy(out + 2 * 4 + LZMA_STREAM_FLAGS_SIZE,
			lzma_footer_magic, sizeof(lzma_footer_magic));

	return LZMA_OK;
}